

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

object * floor_object_for_use(player *p,object *obj,wchar_t num,_Bool message,_Bool *none_left)

{
  object *poVar1;
  _Bool _Var2;
  loc_conflict lVar3;
  wchar_t local_9c;
  char local_88 [8];
  char name [80];
  object *local_30;
  object *usable;
  _Bool *none_left_local;
  _Bool message_local;
  wchar_t num_local;
  object *obj_local;
  player *p_local;
  
  local_9c = num;
  if ((int)(uint)obj->number < num) {
    local_9c = (wchar_t)obj->number;
  }
  if (local_9c < (int)(uint)obj->number) {
    local_30 = object_split(obj,local_9c);
  }
  else {
    square_excise_object((chunk *)p->cave,obj->grid,obj->known);
    delist_object((chunk_conflict *)p->cave,obj->known);
    square_excise_object((chunk *)cave,obj->grid,obj);
    delist_object(cave,obj);
    *none_left = true;
    _Var2 = tracked_object_is(p->upkeep,obj);
    if (_Var2) {
      track_object(p->upkeep,(object *)0x0);
    }
    cmd_disable_repeat();
    local_30 = obj;
  }
  poVar1 = local_30->known;
  lVar3 = (loc_conflict)loc(0,0);
  poVar1->grid = lVar3;
  lVar3 = (loc_conflict)loc(0,0);
  local_30->grid = lVar3;
  if (message) {
    if (local_30 == obj) {
      obj->number = '\0';
    }
    object_desc(local_88,0x50,obj,0x43,p);
    if (local_30 == obj) {
      obj->number = (uint8_t)local_9c;
    }
    msg("You see %s.",local_88);
  }
  return local_30;
}

Assistant:

struct object *floor_object_for_use(struct player *p, struct object *obj,
	int num, bool message, bool *none_left)
{
	struct object *usable;
	char name[80];

	/* Bounds check */
	num = MIN(num, obj->number);

	/* Split off a usable object if necessary */
	if (obj->number > num) {
		usable = object_split(obj, num);
	} else {
		usable = obj;
		square_excise_object(p->cave, usable->grid, usable->known);
		delist_object(p->cave, usable->known);
		square_excise_object(cave, usable->grid, usable);
		delist_object(cave, usable);
		*none_left = true;

		/* Stop tracking item */
		if (tracked_object_is(p->upkeep, obj))
			track_object(p->upkeep, NULL);

		/* The pile is gone, so disable repeat command */
		cmd_disable_repeat();
	}

	/* Object no longer has a location */
	usable->known->grid = loc(0, 0);
	usable->grid = loc(0, 0);

	/* Print a message if requested and there is anything left */
	if (message) {
		if (usable == obj)
			obj->number = 0;

		/* Get a description */
		object_desc(name, sizeof(name), obj,
			ODESC_PREFIX | ODESC_FULL, p);

		if (usable == obj)
			obj->number = num;

		/* Print a message */
		msg("You see %s.", name);
	}

	return usable;
}